

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringUtilities.cpp
# Opt level: O2

string * soul::simplifyWhitespace(string *__return_storage_ptr__,string *s)

{
  string_view firstReplacement;
  string_view firstReplacement_00;
  bool bVar1;
  string_view firstToReplace;
  string_view firstToReplace_00;
  string_view t;
  string_view s_00;
  _Alloc_hider in_stack_ffffffffffffff50;
  string local_90;
  string local_70 [32];
  string local_50;
  
  std::__cxx11::string::string((string *)&local_90,(string *)s);
  choc::text::trim((string *)&stack0xffffffffffffff50,&local_90);
  firstReplacement._M_str = " ";
  firstReplacement._M_len = (size_t)"\r";
  firstToReplace._M_str = (char *)0x1;
  firstToReplace._M_len = (size_t)"\t";
  choc::text::
  replace<std::__cxx11::string,char_const(&)[2],char_const(&)[2],char_const(&)[2],char_const(&)[2]>
            (&local_50,(text *)&stack0xffffffffffffff50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1,firstToReplace
             ,firstReplacement,(char (*) [2])0x29b4bd,(char (*) [2])0x2743dd,(char (*) [2])0x29b4bd,
             (char (*) [2])__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)s,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::__cxx11::string::~string((string *)&local_90);
  while( true ) {
    t._M_str = (s->_M_dataplus)._M_p;
    t._M_len = s->_M_string_length;
    s_00._M_str = "  ";
    s_00._M_len = 2;
    bVar1 = choc::text::contains(t,s_00);
    if (!bVar1) break;
    std::__cxx11::string::string(local_70,(string *)s);
    firstReplacement_00._M_str = in_stack_ffffffffffffff50._M_p;
    firstReplacement_00._M_len = (size_t)__return_storage_ptr__;
    firstToReplace_00._M_str = (char *)0x1;
    firstToReplace_00._M_len = (size_t)"  ";
    choc::text::replace<std::__cxx11::string>
              (&local_50,(text *)local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2,
               firstToReplace_00,firstReplacement_00);
    std::__cxx11::string::operator=((string *)s,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string(local_70);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  return __return_storage_ptr__;
}

Assistant:

std::string simplifyWhitespace (std::string s)
{
    s = choc::text::replace (choc::text::trim (s), "\t", " ", "\r", " ", "\n", " ");

    while (choc::text::contains (s, "  "))
        s = choc::text::replace (s, "  ", " ");

    return s;
}